

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

ON_NameHash * __thiscall ON_ModelComponent::Internal_NameHash(ON_ModelComponent *this)

{
  bool bVar1;
  ON_UUID *local_60;
  ON_NameHash local_4c;
  undefined1 local_21;
  undefined1 auStack_20 [7];
  bool bIgnoreCase;
  ON_UUID name_parent_id;
  ON_ModelComponent *this_local;
  
  name_parent_id.Data4 = (uchar  [8])this;
  bVar1 = ON_NameHash::IsEmptyNameHash(&this->m_component_name_hash);
  if ((bVar1) && (bVar1 = ON_wString::IsNotEmpty(&this->m_component_name), bVar1)) {
    bVar1 = UniqueNameIncludesParent(this->m_component_type);
    if (bVar1) {
      local_60 = &this->m_component_parent_id;
    }
    else {
      local_60 = &ON_nil_uuid;
    }
    auStack_20._0_4_ = local_60->Data1;
    auStack_20._4_2_ = local_60->Data2;
    unique0x00012006 = local_60->Data3;
    name_parent_id._0_8_ = *(undefined8 *)local_60->Data4;
    local_21 = UniqueNameIgnoresCase(this->m_component_type);
    ON_NameHash::Create(&local_4c,(ON_UUID *)auStack_20,&this->m_component_name,(bool)local_21);
    memcpy(&this->m_component_name_hash,&local_4c,0x28);
  }
  return &this->m_component_name_hash;
}

Assistant:

const ON_NameHash& ON_ModelComponent::Internal_NameHash() const
{
  if (m_component_name_hash.IsEmptyNameHash() && m_component_name.IsNotEmpty())
  {
    // lazy evaluation because SHA-1 calculation takes appreciable time

    // For components whose names are in a tree structure, like layers,
    // the parent id must be included.
    // For all other components, the parent id must be ignored.
    const ON_UUID name_parent_id 
      = ON_ModelComponent::UniqueNameIncludesParent(m_component_type)
      ? m_component_parent_id 
      : ON_nil_uuid;
    const bool bIgnoreCase = ON_ModelComponent::UniqueNameIgnoresCase(m_component_type);
    m_component_name_hash = ON_NameHash::Create(name_parent_id,m_component_name,bIgnoreCase);
  }
  return m_component_name_hash;
}